

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateOptionalArrayedI32
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  Op OVar1;
  Instruction *this_00;
  uint32_t local_34;
  spv_result_t error;
  uint32_t underlying_type;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *diag_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  local_34 = 0;
  _error = diag;
  diag_local = (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  this_local._4_4_ = GetUnderlyingType(this->_,decoration,inst,&local_34);
  if (this_local._4_4_ == SPV_SUCCESS) {
    OVar1 = ValidationState_t::GetIdOpcode(this->_,local_34);
    if (OVar1 == OpTypeArray) {
      this_00 = ValidationState_t::FindDef(this->_,local_34);
      local_34 = Instruction::word(this_00,2);
    }
    this_local._4_4_ =
         ValidateI32Helper(this,(Decoration *)inst_local,(Instruction *)diag_local,_error,local_34);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateOptionalArrayedI32(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  // Strip the array, if present.
  if (_.GetIdOpcode(underlying_type) == spv::Op::OpTypeArray) {
    underlying_type = _.FindDef(underlying_type)->word(2u);
  }

  return ValidateI32Helper(decoration, inst, diag, underlying_type);
}